

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osh_adapt.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  Alloc *pAVar1;
  Alloc *pAVar2;
  Alloc *pAVar3;
  void *pvVar4;
  char cVar5;
  int iVar6;
  string *psVar7;
  ostream *poVar8;
  undefined8 uVar9;
  long lVar10;
  uint uVar11;
  undefined8 in_RSI;
  char *pcVar12;
  Alloc *pAVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  Read<double> metric;
  path metric_in;
  path metric_out;
  path mesh_out;
  string metric_in_ext;
  string metric_out_ext;
  CommPtr comm;
  CmdLine cmdline;
  AdaptOpts opts;
  path mesh_in;
  Mesh mesh;
  Library lib;
  Alloc *local_7b8;
  void *pvStack_7b0;
  long local_7a8 [2];
  Read<double> local_798;
  long local_788 [2];
  long *local_778 [2];
  long local_768 [2];
  Alloc *local_758 [2];
  long local_748 [2];
  Read<double> local_738;
  long *local_728 [2];
  long local_718 [2];
  undefined1 local_704 [20];
  long local_6f0 [2];
  long *local_6e0 [2];
  long local_6d0 [2];
  undefined8 local_6c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_6b8;
  undefined8 local_6b0;
  Read<double> local_6a8;
  Alloc *local_698;
  void *local_690;
  Alloc *local_688;
  void *local_680;
  Alloc *local_678;
  void *local_670;
  Alloc *local_668;
  void *local_660;
  undefined8 local_658;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_650;
  undefined8 local_648;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_640;
  CmdLine local_638 [24];
  vector<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>_>_>
  local_620 [40];
  Alloc *local_5f8;
  void *pvStack_5f0;
  Alloc local_5e8;
  undefined7 uStack_5e7;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h_Transfer>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h_Transfer>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h_Transfer>_>_>
  local_5a8 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_578 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_548 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_518 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>_>
  local_4e8 [56];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4b0;
  ulong local_4a0;
  long *local_498 [2];
  long local_488 [2];
  undefined8 local_478;
  long local_468 [121];
  Library local_a0;
  
  local_a0.timers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a0.timers._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a0.timers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a0.timers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a0.argv_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.argv_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.argv_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0.world_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_a0.world_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a0.self_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_a0.self_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a0.timers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_6b0 = in_RSI;
  local_a0.timers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a0.timers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Omega_h::Library::initialize
            ((char *)&local_a0,(int *)"9.34.13-sha.dc235450+00000010000000001",(char ***)local_704);
  Omega_h::Library::world();
  Omega_h::CmdLine::CmdLine(local_638);
  local_478 = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"--mesh-in","");
  pAVar13 = &local_5e8;
  local_5f8 = pAVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"input mesh file path","");
  psVar7 = (string *)Omega_h::CmdLine::add_flag((string *)local_638,(string *)&local_478);
  if (local_5f8 != pAVar13) {
    operator_delete(local_5f8,CONCAT71(uStack_5e7,local_5e8) + 1);
  }
  if (local_478 != local_468) {
    operator_delete(local_478,local_468[0] + 1);
  }
  local_478 = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"mesh.msh","");
  pvStack_5f0 = (void *)0x0;
  local_5e8 = (Alloc)0x0;
  local_5f8 = pAVar13;
  Omega_h::CmdLineFlag::add_arg<std::__cxx11::string>(psVar7,(string *)&local_478);
  if (local_5f8 != pAVar13) {
    operator_delete(local_5f8,CONCAT71(uStack_5e7,local_5e8) + 1);
  }
  if (local_478 != local_468) {
    operator_delete(local_478,local_468[0] + 1);
  }
  local_478 = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"--mesh-out","");
  local_5f8 = pAVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"output mesh file path","");
  psVar7 = (string *)Omega_h::CmdLine::add_flag((string *)local_638,(string *)&local_478);
  if (local_5f8 != pAVar13) {
    operator_delete(local_5f8,CONCAT71(uStack_5e7,local_5e8) + 1);
  }
  if (local_478 != local_468) {
    operator_delete(local_478,local_468[0] + 1);
  }
  local_478 = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"mesh.msh","");
  pvStack_5f0 = (void *)0x0;
  local_5e8 = (Alloc)0x0;
  local_5f8 = pAVar13;
  Omega_h::CmdLineFlag::add_arg<std::__cxx11::string>(psVar7,(string *)&local_478);
  if (local_5f8 != pAVar13) {
    operator_delete(local_5f8,CONCAT71(uStack_5e7,local_5e8) + 1);
  }
  if (local_478 != local_468) {
    operator_delete(local_478,local_468[0] + 1);
  }
  local_478 = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"--metric-in","");
  local_5f8 = pAVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"input metric file path","");
  psVar7 = (string *)Omega_h::CmdLine::add_flag((string *)local_638,(string *)&local_478);
  if (local_5f8 != pAVar13) {
    operator_delete(local_5f8,CONCAT71(uStack_5e7,local_5e8) + 1);
  }
  if (local_478 != local_468) {
    operator_delete(local_478,local_468[0] + 1);
  }
  local_478 = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"metric.txt","");
  pvStack_5f0 = (void *)0x0;
  local_5e8 = (Alloc)0x0;
  local_5f8 = pAVar13;
  Omega_h::CmdLineFlag::add_arg<std::__cxx11::string>(psVar7,(string *)&local_478);
  if (local_5f8 != pAVar13) {
    operator_delete(local_5f8,CONCAT71(uStack_5e7,local_5e8) + 1);
  }
  if (local_478 != local_468) {
    operator_delete(local_478,local_468[0] + 1);
  }
  local_478 = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"--metric-out","");
  local_5f8 = pAVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"output metric file path","")
  ;
  psVar7 = (string *)Omega_h::CmdLine::add_flag((string *)local_638,(string *)&local_478);
  if (local_5f8 != pAVar13) {
    operator_delete(local_5f8,CONCAT71(uStack_5e7,local_5e8) + 1);
  }
  if (local_478 != local_468) {
    operator_delete(local_478,local_468[0] + 1);
  }
  local_478 = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"metric.txt","");
  pvStack_5f0 = (void *)0x0;
  local_5e8 = (Alloc)0x0;
  local_5f8 = pAVar13;
  Omega_h::CmdLineFlag::add_arg<std::__cxx11::string>(psVar7,(string *)&local_478);
  if (local_5f8 != pAVar13) {
    operator_delete(local_5f8,CONCAT71(uStack_5e7,local_5e8) + 1);
  }
  if (local_478 != local_468) {
    operator_delete(local_478,local_468[0] + 1);
  }
  local_648 = local_6c0;
  local_640 = local_6b8;
  if (local_6b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_6b8 + 8) = *(int *)(local_6b8 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_6b8 + 8) = *(int *)(local_6b8 + 8) + 1;
    }
  }
  cVar5 = Omega_h::CmdLine::parse_final(local_638,&local_648,local_704,local_6b0);
  if (local_640 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640);
  }
  iVar6 = -1;
  if (cVar5 != '\0') {
    local_478 = local_468;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"--mesh-in","");
    cVar5 = Omega_h::CmdLine::parsed((string *)local_638);
    if (local_478 != local_468) {
      operator_delete(local_478,local_468[0] + 1);
    }
    if (cVar5 == '\0') {
      lVar10 = 0x1d;
      pcVar12 = "No input mesh file specified\n";
    }
    else {
      local_478 = local_468;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"--mesh-out","");
      cVar5 = Omega_h::CmdLine::parsed((string *)local_638);
      if (local_478 != local_468) {
        operator_delete(local_478,local_468[0] + 1);
      }
      if (cVar5 == '\0') {
        lVar10 = 0x1e;
        pcVar12 = "No output mesh file specified\n";
      }
      else {
        local_478 = local_468;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"--metric-in","");
        cVar5 = Omega_h::CmdLine::parsed((string *)local_638);
        if (local_478 != local_468) {
          operator_delete(local_478,local_468[0] + 1);
        }
        if (cVar5 != '\0') {
          local_5f8 = pAVar13;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"--mesh-in","");
          local_728[0] = local_718;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_728,"mesh.msh","");
          Omega_h::CmdLine::get<std::__cxx11::string>((string *)&local_478,(string *)local_638);
          Omega_h::filesystem::path::path((path *)local_498,(string *)&local_478);
          if (local_478 != local_468) {
            operator_delete(local_478,local_468[0] + 1);
          }
          if (local_728[0] != local_718) {
            operator_delete(local_728[0],local_718[0] + 1);
          }
          if (local_5f8 != pAVar13) {
            operator_delete(local_5f8,CONCAT71(uStack_5e7,local_5e8) + 1);
          }
          local_5f8 = pAVar13;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"--mesh-out","");
          local_778[0] = local_768;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_778,"mesh.msh","");
          Omega_h::CmdLine::get<std::__cxx11::string>((string *)&local_478,(string *)local_638);
          Omega_h::filesystem::path::path((path *)local_728,(string *)&local_478);
          if (local_478 != local_468) {
            operator_delete(local_478,local_468[0] + 1);
          }
          if (local_778[0] != local_768) {
            operator_delete(local_778[0],local_768[0] + 1);
          }
          if (local_5f8 != pAVar13) {
            operator_delete(local_5f8,CONCAT71(uStack_5e7,local_5e8) + 1);
          }
          local_5f8 = pAVar13;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"--metric-in","");
          local_704._4_8_ = local_6f0;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_704 + 4),"metric.txt","")
          ;
          Omega_h::CmdLine::get<std::__cxx11::string>((string *)&local_478,(string *)local_638);
          Omega_h::filesystem::path::path((path *)local_778,(string *)&local_478);
          if (local_478 != local_468) {
            operator_delete(local_478,local_468[0] + 1);
          }
          if ((long *)local_704._4_8_ != local_6f0) {
            operator_delete((void *)local_704._4_8_,local_6f0[0] + 1);
          }
          if (local_5f8 != pAVar13) {
            operator_delete(local_5f8,CONCAT71(uStack_5e7,local_5e8) + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Loading mesh from ",0x12);
          poVar8 = (ostream *)
                   Omega_h::filesystem::operator<<((ostream *)&std::cout,(path *)local_498);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          local_658 = local_6c0;
          local_650 = local_6b8;
          if (local_6b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(local_6b8 + 8) = *(int *)(local_6b8 + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(local_6b8 + 8) = *(int *)(local_6b8 + 8) + 1;
            }
          }
          Omega_h::gmsh::read(&local_478,local_498,&local_658);
          if (local_650 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_650);
          }
          local_738.write_.shared_alloc_.alloc = (Alloc *)0x0;
          local_738.write_.shared_alloc_.direct_ptr = (void *)0x0;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Loading target metric from ",0x1b);
          poVar8 = (ostream *)
                   Omega_h::filesystem::operator<<((ostream *)&std::cout,(path *)local_778);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          uVar11 = local_478._4_4_;
          uVar14 = (ulong)local_478._4_4_;
          if (local_478._4_4_ < 4) {
            Omega_h::filesystem::path::extension();
            Omega_h::filesystem::path::string_abi_cxx11_();
            if (local_5f8 != pAVar13) {
              operator_delete(local_5f8,CONCAT71(uStack_5e7,local_5e8) + 1);
            }
            iVar6 = std::__cxx11::string::compare(local_704 + 4);
            if (iVar6 == 0) {
              iVar6 = Omega_h::Mesh::nverts();
              uVar11 = (uVar11 + 1) * uVar11 >> 1;
              Omega_h::read_reals_txt((path *)&local_5f8,(int)local_778,iVar6);
              local_738.write_.shared_alloc_.alloc = local_5f8;
              local_738.write_.shared_alloc_.direct_ptr = pvStack_5f0;
              if ((((ulong)local_5f8 & 7) == 0 && local_5f8 != (Alloc *)0x0) &&
                 ((char)Omega_h::entering_parallel == '\x01')) {
                *(int *)(local_5f8 + 0x30) = *(int *)(local_5f8 + 0x30) + -1;
                local_738.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_5f8 * 8 + 1);
              }
              pAVar3 = local_738.write_.shared_alloc_.alloc;
              bVar15 = local_738.write_.shared_alloc_.alloc != (Alloc *)0x0;
              bVar16 = ((ulong)local_738.write_.shared_alloc_.alloc & 7) == 0;
              local_668 = local_738.write_.shared_alloc_.alloc;
              if (bVar16 && bVar15) {
                if ((char)Omega_h::entering_parallel == '\x01') {
                  local_668 = (Alloc *)(*(long *)local_738.write_.shared_alloc_.alloc * 8 + 1);
                }
                else {
                  *(int *)(local_738.write_.shared_alloc_.alloc + 0x30) =
                       *(int *)(local_738.write_.shared_alloc_.alloc + 0x30) + 1;
                }
              }
              local_660 = pvStack_5f0;
              Omega_h::symms_inria2osh(&local_5f8,uVar14);
              if (bVar16 && bVar15) {
                pAVar1 = pAVar3 + 0x30;
                *(int *)pAVar1 = *(int *)pAVar1 + -1;
                if (*(int *)pAVar1 == 0) {
                  Omega_h::Alloc::~Alloc(pAVar3);
                  operator_delete(pAVar3,0x48);
                }
              }
              pvVar4 = pvStack_5f0;
              pAVar3 = local_668;
              local_738.write_.shared_alloc_.alloc = local_5f8;
              local_738.write_.shared_alloc_.direct_ptr = pvStack_5f0;
              local_4a0 = uVar14;
              if ((((ulong)local_5f8 & 7) == 0 && local_5f8 != (Alloc *)0x0) &&
                 ((char)Omega_h::entering_parallel == '\x01')) {
                *(int *)(local_5f8 + 0x30) = *(int *)(local_5f8 + 0x30) + -1;
                local_738.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_5f8 * 8 + 1);
              }
              pAVar1 = local_738.write_.shared_alloc_.alloc;
              local_5f8 = (Alloc *)0x0;
              pvStack_5f0 = (void *)0x0;
              if (((ulong)local_668 & 7) == 0 && local_668 != (Alloc *)0x0) {
                pAVar2 = local_668 + 0x30;
                *(int *)pAVar2 = *(int *)pAVar2 + -1;
                if (*(int *)pAVar2 == 0) {
                  Omega_h::Alloc::~Alloc(local_668);
                  operator_delete(pAVar3,0x48);
                }
              }
              local_5f8 = pAVar13;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_5f8,"target_metric","");
              bVar15 = pAVar1 != (Alloc *)0x0;
              bVar16 = ((ulong)pAVar1 & 7) == 0;
              local_678 = pAVar1;
              if (bVar16 && bVar15) {
                if ((char)Omega_h::entering_parallel == '\x01') {
                  local_678 = (Alloc *)(*(long *)pAVar1 * 8 + 1);
                }
                else {
                  *(int *)(pAVar1 + 0x30) = *(int *)(pAVar1 + 0x30) + 1;
                }
              }
              local_670 = pvVar4;
              Omega_h::Mesh::add_tag<double>(&local_478,0,&local_5f8,uVar11,&local_678,0);
              pAVar3 = local_678;
              if (((ulong)local_678 & 7) == 0 && local_678 != (Alloc *)0x0) {
                pAVar2 = local_678 + 0x30;
                *(int *)pAVar2 = *(int *)pAVar2 + -1;
                if (*(int *)pAVar2 == 0) {
                  Omega_h::Alloc::~Alloc(local_678);
                  operator_delete(pAVar3,0x48);
                }
              }
              if (local_5f8 != pAVar13) {
                operator_delete(local_5f8,CONCAT71(uStack_5e7,local_5e8) + 1);
              }
              Omega_h::AdaptOpts::AdaptOpts((AdaptOpts *)&local_5f8,(Mesh *)&local_478);
              local_688 = pAVar1;
              if (bVar16 && bVar15) {
                if ((char)Omega_h::entering_parallel == '\x01') {
                  local_688 = (Alloc *)(*(long *)pAVar1 * 8 + 1);
                }
                else {
                  *(int *)(pAVar1 + 0x30) = *(int *)(pAVar1 + 0x30) + 1;
                }
              }
              local_680 = pvVar4;
              Omega_h::grade_fix_adapt(&local_478,&local_5f8,&local_688,1);
              pAVar13 = local_688;
              if (((ulong)local_688 & 7) == 0 && local_688 != (Alloc *)0x0) {
                pAVar3 = local_688 + 0x30;
                *(int *)pAVar3 = *(int *)pAVar3 + -1;
                if (*(int *)pAVar3 == 0) {
                  Omega_h::Alloc::~Alloc(local_688);
                  operator_delete(pAVar13,0x48);
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Storing mesh in ",0x10);
              poVar8 = (ostream *)
                       Omega_h::filesystem::operator<<((ostream *)&std::cout,(path *)local_728);
              local_758[0] = (Alloc *)CONCAT71(local_758[0]._1_7_,10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_758,1);
              Omega_h::gmsh::write((path *)local_728,(Mesh *)&local_478);
              pAVar13 = (Alloc *)local_748;
              local_758[0] = pAVar13;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_758,"--metric-out","")
              ;
              cVar5 = Omega_h::CmdLine::parsed((string *)local_638);
              if (local_758[0] != pAVar13) {
                operator_delete(local_758[0],local_748[0] + 1);
              }
              if (cVar5 != '\0') {
                local_7b8 = (Alloc *)local_7a8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_7b8,"--metric-out","");
                local_798.write_.shared_alloc_.alloc = (Alloc *)local_788;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_798,"metric.txt","");
                Omega_h::CmdLine::get<std::__cxx11::string>((string *)local_6e0,(string *)local_638)
                ;
                Omega_h::filesystem::path::path((path *)local_758,(string *)local_6e0);
                if (local_6e0[0] != local_6d0) {
                  operator_delete(local_6e0[0],local_6d0[0] + 1);
                }
                if (local_798.write_.shared_alloc_.alloc != (Alloc *)local_788) {
                  operator_delete(local_798.write_.shared_alloc_.alloc,local_788[0] + 1);
                }
                if (local_7b8 != (Alloc *)local_7a8) {
                  operator_delete(local_7b8,local_7a8[0] + 1);
                }
                Omega_h::filesystem::path::extension();
                Omega_h::filesystem::path::string_abi_cxx11_();
                if (local_7b8 != (Alloc *)local_7a8) {
                  operator_delete(local_7b8,local_7a8[0] + 1);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Storing metric in ",0x12);
                poVar8 = (ostream *)
                         Omega_h::filesystem::operator<<((ostream *)&std::cout,(path *)local_758);
                local_7b8 = (Alloc *)CONCAT71(local_7b8._1_7_,10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_7b8,1);
                iVar6 = std::__cxx11::string::compare((char *)local_6e0);
                if (iVar6 != 0) goto LAB_0010476f;
                local_7b8 = (Alloc *)local_7a8;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b8,"metric","");
                Omega_h::Mesh::get_array<double>((int)&local_798,(string *)&local_478);
                if (local_7b8 != (Alloc *)local_7a8) {
                  operator_delete(local_7b8,local_7a8[0] + 1);
                }
                uVar14 = local_4a0;
                local_698 = local_798.write_.shared_alloc_.alloc;
                if (((ulong)local_798.write_.shared_alloc_.alloc & 7) == 0 &&
                    local_798.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                  if ((char)Omega_h::entering_parallel == '\x01') {
                    local_698 = (Alloc *)(*(long *)local_798.write_.shared_alloc_.alloc * 8 + 1);
                  }
                  else {
                    *(int *)(local_798.write_.shared_alloc_.alloc + 0x30) =
                         *(int *)(local_798.write_.shared_alloc_.alloc + 0x30) + 1;
                  }
                }
                local_690 = local_798.write_.shared_alloc_.direct_ptr;
                Omega_h::symms_osh2inria(&local_7b8,uVar14);
                pAVar3 = local_798.write_.shared_alloc_.alloc;
                if (((ulong)local_798.write_.shared_alloc_.alloc & 7) == 0 &&
                    local_798.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                  pAVar2 = local_798.write_.shared_alloc_.alloc + 0x30;
                  *(int *)pAVar2 = *(int *)pAVar2 + -1;
                  if (*(int *)pAVar2 == 0) {
                    Omega_h::Alloc::~Alloc(local_798.write_.shared_alloc_.alloc);
                    operator_delete(pAVar3,0x48);
                  }
                }
                local_798.write_.shared_alloc_.alloc = local_7b8;
                local_798.write_.shared_alloc_.direct_ptr = pvStack_7b0;
                if ((((ulong)local_7b8 & 7) == 0 && local_7b8 != (Alloc *)0x0) &&
                   ((char)Omega_h::entering_parallel == '\x01')) {
                  *(int *)(local_7b8 + 0x30) = *(int *)(local_7b8 + 0x30) + -1;
                  local_798.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_7b8 * 8 + 1);
                }
                pAVar3 = local_698;
                local_7b8 = (Alloc *)0x0;
                pvStack_7b0 = (void *)0x0;
                if (((ulong)local_698 & 7) == 0 && local_698 != (Alloc *)0x0) {
                  pAVar2 = local_698 + 0x30;
                  *(int *)pAVar2 = *(int *)pAVar2 + -1;
                  if (*(int *)pAVar2 == 0) {
                    Omega_h::Alloc::~Alloc(pAVar3);
                    operator_delete(pAVar3,0x48);
                  }
                }
                local_6a8.write_.shared_alloc_.alloc = local_798.write_.shared_alloc_.alloc;
                if (((ulong)local_798.write_.shared_alloc_.alloc & 7) == 0 &&
                    local_798.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                  if ((char)Omega_h::entering_parallel == '\x01') {
                    local_6a8.write_.shared_alloc_.alloc =
                         (Alloc *)(*(long *)local_798.write_.shared_alloc_.alloc * 8 + 1);
                  }
                  else {
                    *(int *)(local_798.write_.shared_alloc_.alloc + 0x30) =
                         *(int *)(local_798.write_.shared_alloc_.alloc + 0x30) + 1;
                  }
                }
                local_6a8.write_.shared_alloc_.direct_ptr =
                     local_798.write_.shared_alloc_.direct_ptr;
                Omega_h::write_reals_txt(local_758,&local_6a8,uVar11);
                pAVar3 = local_6a8.write_.shared_alloc_.alloc;
                if (((ulong)local_6a8.write_.shared_alloc_.alloc & 7) == 0 &&
                    local_6a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                  pAVar2 = local_6a8.write_.shared_alloc_.alloc + 0x30;
                  *(int *)pAVar2 = *(int *)pAVar2 + -1;
                  if (*(int *)pAVar2 == 0) {
                    Omega_h::Alloc::~Alloc(pAVar3);
                    operator_delete(pAVar3,0x48);
                  }
                }
                pAVar3 = local_798.write_.shared_alloc_.alloc;
                if (((ulong)local_798.write_.shared_alloc_.alloc & 7) == 0 &&
                    local_798.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                  pAVar2 = local_798.write_.shared_alloc_.alloc + 0x30;
                  *(int *)pAVar2 = *(int *)pAVar2 + -1;
                  if (*(int *)pAVar2 == 0) {
                    Omega_h::Alloc::~Alloc(local_798.write_.shared_alloc_.alloc);
                    operator_delete(pAVar3,0x48);
                  }
                }
                if (local_6e0[0] != local_6d0) {
                  operator_delete(local_6e0[0],local_6d0[0] + 1);
                }
                if (local_758[0] != pAVar13) {
                  operator_delete(local_758[0],local_748[0] + 1);
                }
              }
              if (local_4b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4b0);
              }
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>_>
              ::~_Rb_tree(local_4e8);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(local_518);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(local_548);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(local_578);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h_Transfer>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h_Transfer>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h_Transfer>_>_>
              ::~_Rb_tree(local_5a8);
              if ((long *)local_704._4_8_ != local_6f0) {
                operator_delete((void *)local_704._4_8_,local_6f0[0] + 1);
              }
              if (bVar16 && bVar15) {
                pAVar13 = pAVar1 + 0x30;
                *(int *)pAVar13 = *(int *)pAVar13 + -1;
                if (*(int *)pAVar13 == 0) {
                  Omega_h::Alloc::~Alloc(pAVar1);
                  operator_delete(pAVar1,0x48);
                }
              }
              Omega_h::Mesh::~Mesh((Mesh *)&local_478);
              if (local_778[0] != local_768) {
                operator_delete(local_778[0],local_768[0] + 1);
              }
              if (local_728[0] != local_718) {
                operator_delete(local_728[0],local_718[0] + 1);
              }
              if (local_498[0] != local_488) {
                operator_delete(local_498[0],local_488[0] + 1);
              }
              iVar6 = 0;
              goto LAB_00103d95;
            }
          }
          else {
            Omega_h::fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
                          ,0x33);
          }
          uVar9 = Omega_h::filesystem::path::c_str();
          Omega_h::fail("unknown extension for \"%s\"\n",uVar9);
LAB_0010476f:
          uVar9 = Omega_h::filesystem::path::c_str();
          uVar9 = Omega_h::fail("unknown extension for \"%s\"\n",uVar9);
          Omega_h::Read<double>::~Read(&local_6a8);
          Omega_h::Read<double>::~Read(&local_798);
          if (local_6e0[0] != local_6d0) {
            operator_delete(local_6e0[0],local_6d0[0] + 1);
          }
          if (local_758[0] != pAVar13) {
            operator_delete(local_758[0],local_748[0] + 1);
          }
          Omega_h::AdaptOpts::~AdaptOpts((AdaptOpts *)&local_5f8);
          if ((long *)local_704._4_8_ != local_6f0) {
            operator_delete((void *)local_704._4_8_,local_6f0[0] + 1);
          }
          Omega_h::Read<double>::~Read(&local_738);
          Omega_h::Mesh::~Mesh((Mesh *)&local_478);
          if (local_778[0] != local_768) {
            operator_delete(local_778[0],local_768[0] + 1);
          }
          if (local_728[0] != local_718) {
            operator_delete(local_728[0],local_718[0] + 1);
          }
          if (local_498[0] != local_488) {
            operator_delete(local_498[0],local_488[0] + 1);
          }
          std::
          vector<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>_>_>
          ::~vector(local_620);
          std::
          vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
          ::~vector((vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
                     *)local_638);
          if (local_6b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_6b8);
          }
          Omega_h::Library::~Library(&local_a0);
          _Unwind_Resume(uVar9);
        }
        lVar10 = 0x1f;
        pcVar12 = "No input metric file specified\n";
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar12,lVar10);
    Omega_h::CmdLine::show_help((char **)local_638);
  }
LAB_00103d95:
  std::
  vector<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>_>_>
  ::~vector(local_620);
  std::
  vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
  ::~vector((vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
             *)local_638);
  if (local_6b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_6b8);
  }
  Omega_h::Library::~Library(&local_a0);
  return iVar6;
}

Assistant:

int main(int argc, char** argv) {
  auto lib = Omega_h::Library(&argc, &argv);
  auto comm = lib.world();
  Omega_h::CmdLine cmdline;
#ifdef OMEGA_H_USE_LIBMESHB
  auto metric_doc = "metric.{txt,sol}";
#else
  auto metric_doc = "metric.txt";
#endif
  auto& mesh_in_flag = cmdline.add_flag("--mesh-in", "input mesh file path");
  mesh_in_flag.add_arg<std::string>("mesh.msh");
  auto& mesh_out_flag = cmdline.add_flag("--mesh-out", "output mesh file path");
  mesh_out_flag.add_arg<std::string>("mesh.msh");
  auto& metric_in_flag =
      cmdline.add_flag("--metric-in", "input metric file path");
  metric_in_flag.add_arg<std::string>(metric_doc);
  auto& metric_out_flag =
      cmdline.add_flag("--metric-out", "output metric file path");
  metric_out_flag.add_arg<std::string>(metric_doc);
  if (!cmdline.parse_final(comm, &argc, argv)) {
    return -1;
  }
  if (!cmdline.parsed("--mesh-in")) {
    std::cout << "No input mesh file specified\n";
    cmdline.show_help(argv);
    return -1;
  }
  if (!cmdline.parsed("--mesh-out")) {
    std::cout << "No output mesh file specified\n";
    cmdline.show_help(argv);
    return -1;
  }
  if (!cmdline.parsed("--metric-in")) {
    std::cout << "No input metric file specified\n";
    cmdline.show_help(argv);
    return -1;
  }
  Omega_h::filesystem::path mesh_in =
      cmdline.get<std::string>("--mesh-in", "mesh.msh");
  Omega_h::filesystem::path mesh_out =
      cmdline.get<std::string>("--mesh-out", "mesh.msh");
  Omega_h::filesystem::path metric_in =
      cmdline.get<std::string>("--metric-in", metric_doc);
  std::cout << "Loading mesh from " << mesh_in << "\n";
  auto mesh = Omega_h::gmsh::read(mesh_in, comm);
  Omega_h::Reals target_metric;
  std::cout << "Loading target metric from " << metric_in << "\n";
  auto const dim = mesh.dim();
  auto const metric_in_ext = metric_in.extension().string();
  if (metric_in_ext == ".txt") {
    target_metric = Omega_h::read_reals_txt(
        metric_in, mesh.nverts(), Omega_h::symm_ncomps(dim));
    target_metric = Omega_h::symms_inria2osh(dim, target_metric);
    mesh.add_tag(0, "target_metric", Omega_h::symm_ncomps(dim), target_metric);
  } else
#ifdef OMEGA_H_USE_LIBMESHB
      if (metric_in_ext == ".sol" || metric_in_ext == ".solb") {
    Omega_h::meshb::read_sol(&mesh, metric_in.c_str(), "target_metric");
    target_metric = mesh.get_array<Omega_h::Real>(0, "target_metric");
  } else
#endif
  {
    Omega_h_fail("unknown extension for \"%s\"\n", metric_in.c_str());
  }
  auto opts = Omega_h::AdaptOpts(&mesh);
  Omega_h::grade_fix_adapt(&mesh, opts, target_metric, /*verbose=*/true);
  std::cout << "Storing mesh in " << mesh_out << '\n';
  Omega_h::gmsh::write(mesh_out, &mesh);
  if (cmdline.parsed("--metric-out")) {
    Omega_h::filesystem::path metric_out =
        cmdline.get<std::string>("--metric-out", metric_doc);
    auto const metric_out_ext = metric_out.extension().string();
    std::cout << "Storing metric in " << metric_out << '\n';
    if (metric_out_ext == ".txt") {
      auto metric = mesh.get_array<Omega_h::Real>(0, "metric");
      metric = Omega_h::symms_osh2inria(dim, metric);
      Omega_h::write_reals_txt(metric_out, metric, Omega_h::symm_ncomps(dim));
    } else
#ifdef OMEGA_H_USE_LIBMESHB
        if (metric_out_ext == ".sol" || metric_out_ext == ".solb") {
      Omega_h::meshb::write_sol(&mesh, metric_out.c_str(), "metric");
    } else
#endif
    {
      Omega_h_fail("unknown extension for \"%s\"\n", metric_out.c_str());
    }
  }
}